

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O0

planck_unit_suite_t * cpp_wrapper1_getsuite_1(void)

{
  planck_unit_suite_t *suite_00;
  planck_unit_suite_t *suite;
  
  suite_00 = planck_unit_new_suite();
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_delete_empty_all,"test_cpp_wrapper_delete_empty_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
            );
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_delete_nonexist_single_all,
             "test_cpp_wrapper_delete_nonexist_single_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
            );
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_delete_nonexist_several_all,
             "test_cpp_wrapper_delete_nonexist_several_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
            );
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_delete_single_all,"test_cpp_wrapper_delete_single_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
            );
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_delete_single_several_all,
             "test_cpp_wrapper_delete_single_several_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
            );
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_delete_all_all,"test_cpp_wrapper_delete_all_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
            );
  planck_unit_add_to_suite
            (suite_00,test_cpp_wrapper_delete_then_insert_all,
             "test_cpp_wrapper_delete_then_insert_all",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
            );
  return suite_00;
}

Assistant:

planck_unit_suite_t *
cpp_wrapper1_getsuite_1(
) {
	planck_unit_suite_t *suite = planck_unit_new_suite();

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_delete_empty_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_delete_nonexist_single_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_delete_nonexist_several_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_delete_single_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_delete_single_several_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_delete_all_all);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_cpp_wrapper_delete_then_insert_all);

	return suite;
}